

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printBreak(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  Ref *pRVar3;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"break");
  pRVar3 = Ref::operator[](&local_20,1);
  bVar2 = Ref::operator!(pRVar3);
  if (!bVar2) {
    maybeSpace(this,' ');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ' ';
    pRVar3 = Ref::operator[](&local_20,1);
    if (pRVar3->inst->type != String) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0xeb,"const char *cashew::Value::getCString()");
    }
    emit(this,(pRVar3->inst->field_1).str.str._M_str);
  }
  return;
}

Assistant:

void printBreak(Ref node) {
    emit("break");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }